

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall mock_visitor<bool>::mock_visitor(mock_visitor<bool> *this)

{
  MockSpec<test_result_(bool)> *this_00;
  OnCallSpec<test_result_(bool)> *this_01;
  linked_ptr<testing::ActionInterface<test_result_(bool)>_> local_48;
  Matcher<bool> local_38;
  
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this);
  (this->gmock1_visit_268).super_FunctionMockerBase<test_result_(bool)>.current_spec_.
  function_mocker_ = (FunctionMockerBase<test_result_(bool)> *)this;
  (this->gmock1_visit_268).super_FunctionMockerBase<test_result_(bool)>.current_spec_.matchers_.f0_.
  super_MatcherBase<bool>.impl_.value_ = (MatcherInterface<bool> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_visit_268).super_FunctionMockerBase<test_result_(bool)>.current_spec_.
          matchers_.f0_.super_MatcherBase<bool>.impl_ + 8))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_visit_268).super_FunctionMockerBase<test_result_(bool)>.current_spec_.
               matchers_.f0_.super_MatcherBase<bool>.impl_ + 8);
  (this->gmock1_visit_268).super_FunctionMockerBase<test_result_(bool)>.current_spec_.matchers_.f0_.
  super_MatcherBase<bool>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001d4c28;
  (this->gmock1_visit_268).super_FunctionMockerBase<test_result_(bool)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001d4b58;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock0_unexpected_269);
  (this->gmock0_unexpected_269).super_FunctionMockerBase<void_()>.current_spec_.function_mocker_ =
       &(this->gmock0_unexpected_269).super_FunctionMockerBase<void_()>;
  (this->gmock0_unexpected_269).super_FunctionMockerBase<void_()>.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_001d4680;
  local_38.super_MatcherBase<bool>.impl_.value_ = (MatcherInterface<bool> *)operator_new(8);
  ((local_38.super_MatcherBase<bool>.impl_.value_)->super_MatcherDescriberInterface).
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_001d4d10;
  local_38.super_MatcherBase<bool>.impl_.link_.next_ = &local_38.super_MatcherBase<bool>.impl_.link_
  ;
  local_38.super_MatcherBase<bool>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001d4c28;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this,this);
  this_00 = testing::internal::FunctionMocker<test_result_(bool)>::With
                      (&this->gmock1_visit_268,&local_38);
  this_01 = testing::internal::MockSpec<test_result_(bool)>::InternalDefaultActionSetAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
                       ,0x109,"*this","visit(_)");
  local_48.value_ = (ActionInterface<test_result_(bool)> *)operator_new(0x10);
  (local_48.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001d4e18;
  local_48.link_.next_ = &local_48.link_;
  testing::internal::OnCallSpec<test_result_(bool)>::WillByDefault
            (this_01,(Action<test_result_(bool)> *)&local_48);
  testing::internal::linked_ptr<testing::ActionInterface<test_result_(bool)>_>::~linked_ptr
            (&local_48);
  local_38.super_MatcherBase<bool>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001d4c70;
  testing::internal::linked_ptr<const_testing::MatcherInterface<bool>_>::~linked_ptr
            (&local_38.super_MatcherBase<bool>.impl_);
  return;
}

Assistant:

mock_visitor() {
    ON_CALL(*this, visit(_)).WillByDefault(testing::Return(test_result()));
  }